

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O1

pcp_ctx_t * pcp_init(uint8_t autodiscovery,pcp_socket_vt_t *socket_vt)

{
  int iVar1;
  pcp_ctx_s *ctx;
  
  ctx = (pcp_ctx_s *)calloc(1,0x7b0);
  pcp_logger_init();
  if (ctx == (pcp_ctx_s *)0x0) {
    ctx = (pcp_ctx_s *)0x0;
  }
  else {
    if (socket_vt == (pcp_socket_vt_t *)0x0) {
      socket_vt = &default_socket_vt;
    }
    ctx->virt_socket_tb = socket_vt;
    iVar1 = pcp_socket_create(ctx,10,2,0);
    ctx->socket = iVar1;
    if (iVar1 == -1) {
      ctx = (pcp_ctx_s *)0x0;
      pcp_logger(PCP_LOGLVL_WARN,"%s","Error occurred while creating a PCP socket.");
    }
    else if (autodiscovery != '\0') {
      psd_add_gws(ctx);
    }
  }
  return ctx;
}

Assistant:

pcp_ctx_t *pcp_init(uint8_t autodiscovery, pcp_socket_vt_t *socket_vt) {
    pcp_ctx_t *ctx = (pcp_ctx_t *)calloc(1, sizeof(pcp_ctx_t));

    pcp_logger_init();

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!ctx) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return NULL;
    }

    if (socket_vt) {
        ctx->virt_socket_tb = socket_vt;
    } else {
        ctx->virt_socket_tb = &default_socket_vt;
    }

    ctx->socket = pcp_socket_create(ctx,
#ifdef PCP_USE_IPV6_SOCKET
                                    AF_INET6,
#else
                                    AF_INET,
#endif
                                    SOCK_DGRAM, 0);

    if (ctx->socket == PCP_INVALID_SOCKET) {
        PCP_LOG(PCP_LOGLVL_WARN, "%s",
                "Error occurred while creating a PCP socket.");

        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return NULL;
    }
    PCP_LOG(PCP_LOGLVL_DEBUG, "%s", "Created a new PCP socket.");

    if (autodiscovery)
        psd_add_gws(ctx);

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return ctx;
}